

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::setup_tightenBound(HModel *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  value_type vVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  double *pdVar8;
  reference pvVar9;
  long in_RDI;
  double dVar10;
  double relax;
  int iCol_3;
  double useTolerance;
  double new_U;
  double new_L;
  double col_U;
  double col_L;
  int iCol_2;
  double value_1;
  int k_3;
  double row_U;
  double row_L;
  double comp_L;
  double comp_U;
  double xmaxUmargin;
  double xminLmargin;
  double lower;
  double upper;
  double value;
  int iCol_1;
  int k_2;
  int myEnd;
  int myStart;
  double xminL;
  double xmaxU;
  int ninfL;
  int ninfU;
  int iRow_1;
  int numberChanged;
  int iPass;
  double big_B;
  vector<double,_std::allocator<double>_> colUpper0;
  vector<double,_std::allocator<double>_> colLower0;
  int iPut;
  int iRow;
  int k_1;
  int iCol;
  int i_1;
  int i;
  int k;
  vector<double,_std::allocator<double>_> ARvalue;
  vector<int,_std::allocator<int>_> ARindex;
  int AcountX;
  vector<int,_std::allocator<int>_> ARstart;
  vector<int,_std::allocator<int>_> iwork;
  allocator_type *in_stack_fffffffffffffd08;
  value_type vVar11;
  allocator_type *in_stack_fffffffffffffd10;
  size_type in_stack_fffffffffffffd18;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd20;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd48;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd50;
  double local_268;
  double local_260;
  double local_258;
  value_type local_250;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  int local_1b4;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  int local_184;
  value_type local_180;
  value_type local_174;
  value_type local_170;
  value_type local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  value_type local_138;
  double local_130;
  int local_128;
  value_type local_124;
  int local_120;
  value_type local_11c;
  double local_118;
  double local_110;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  double local_f0;
  vector<double,_std::allocator<double>_> local_e8;
  vector<double,_std::allocator<double>_> local_d0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  vector<double,_std::allocator<double>_> local_98;
  vector<int,_std::allocator<int>_> local_78;
  int local_5c;
  undefined4 local_54;
  vector<int,_std::allocator<int>_> local_50;
  undefined4 local_24;
  vector<int,_std::allocator<int>_> local_20;
  
  if (*(int *)(in_RDI + 0xc) != 0) {
    local_24 = 0;
    std::allocator<int>::allocator((allocator<int> *)0x17c691);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd20,
               in_stack_fffffffffffffd18,(value_type *)in_stack_fffffffffffffd10,
               in_stack_fffffffffffffd08);
    std::allocator<int>::~allocator((allocator<int> *)0x17c6c5);
    local_54 = 0;
    std::allocator<int>::allocator((allocator<int> *)0x17c6ff);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd20,
               in_stack_fffffffffffffd18,(value_type *)in_stack_fffffffffffffd10,
               in_stack_fffffffffffffd08);
    std::allocator<int>::~allocator((allocator<int> *)0x17c733);
    sVar5 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660));
    local_5c = (int)sVar5;
    std::allocator<int>::allocator((allocator<int> *)0x17c773);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd20,
               in_stack_fffffffffffffd18,(allocator_type *)in_stack_fffffffffffffd10);
    std::allocator<int>::~allocator((allocator<int> *)0x17c79f);
    std::allocator<double>::allocator((allocator<double> *)0x17c7c4);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::allocator<double>::~allocator((allocator<double> *)0x17c7f0);
    for (local_a0 = 0; local_a0 < local_5c; local_a0 = local_a0 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)local_a0);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_20,(long)*pvVar6);
      *pvVar6 = *pvVar6 + 1;
    }
    for (local_a4 = 1; local_a4 <= *(int *)(in_RDI + 0x610); local_a4 = local_a4 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,(long)(local_a4 + -1));
      iVar2 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_20,(long)(local_a4 + -1));
      iVar3 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,(long)local_a4);
      *pvVar6 = iVar2 + iVar3;
    }
    for (local_a8 = 0; local_a8 < *(int *)(in_RDI + 0x610); local_a8 = local_a8 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,(long)local_a8);
      vVar4 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_20,(long)local_a8);
      *pvVar6 = vVar4;
    }
    for (local_ac = 0; local_ac < *(int *)(in_RDI + 0x60c); local_ac = local_ac + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)local_ac);
      for (local_b0 = *pvVar6; iVar2 = local_b0,
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                              (long)(local_ac + 1)), iVar2 < *pvVar6; local_b0 = local_b0 + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)local_b0);
        local_b4 = *pvVar6;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_20,(long)local_b4);
        iVar2 = local_ac;
        local_b8 = *pvVar6;
        *pvVar6 = local_b8 + 1;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)local_b8);
        *pvVar6 = iVar2;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),
                            (long)local_b0);
        vVar11 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_98,(long)local_b8);
        *pvVar7 = vVar11;
      }
    }
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    local_f0 = 10000000000.0;
    local_f4 = 0;
    do {
      local_f8 = 0;
      for (local_fc = 0; local_fc < *(int *)(in_RDI + 0x610); local_fc = local_fc + 1) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f0),
                            (long)local_fc);
        if ((-local_f0 <= *pvVar7) ||
           (pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),
                                (long)local_fc), *pvVar7 <= local_f0)) {
          local_100 = 0;
          local_104 = 0;
          local_110 = 0.0;
          local_118 = 0.0;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,(long)local_fc);
          local_11c = *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_50,(long)(local_fc + 1));
          local_120 = *pvVar6;
          for (local_124 = local_11c; local_124 < local_120; local_124 = local_124 + 1) {
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)local_124);
            local_128 = *pvVar6;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_98,(long)local_124);
            local_130 = *pvVar7;
            if (local_130 <= 0.0) {
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),
                                  (long)local_128);
              local_250 = -*pvVar7;
            }
            else {
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),
                                  (long)local_128);
              local_250 = *pvVar7;
            }
            local_138 = local_250;
            if (local_130 <= 0.0) {
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),
                                  (long)local_128);
              local_258 = -*pvVar7;
            }
            else {
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),
                                  (long)local_128);
              local_258 = *pvVar7;
            }
            local_140 = local_258;
            local_130 = ABS(local_130);
            if (local_f0 <= local_138) {
              local_100 = local_100 + 1;
            }
            else {
              local_110 = local_138 * local_130 + local_110;
            }
            if (local_258 <= -local_f0) {
              local_104 = local_104 + 1;
            }
            else {
              local_118 = local_258 * local_130 + local_118;
            }
          }
          local_110 = ABS(local_110) * 1e-08 + local_110;
          local_118 = ABS(local_118) * -1e-08 + local_118;
          if (ABS(local_118) <= 100000000.0) {
            local_260 = 0.0;
          }
          else {
            local_260 = ABS(local_118) * 1e-12;
          }
          local_148 = local_260;
          if (ABS(local_110) <= 100000000.0) {
            local_268 = 0.0;
          }
          else {
            local_268 = ABS(local_110) * 1e-12;
          }
          local_150 = local_268;
          dVar10 = (double)local_100 * 1e+31 + local_110;
          local_160 = -(double)local_104 * 1e+31 + local_118;
          local_158 = dVar10;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),
                              (long)local_fc);
          dVar1 = local_160;
          if ((*pvVar7 + 1e-07 < dVar10) ||
             (pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f0),
                                  (long)local_fc), dVar1 < *pvVar7 - 1e-07)) {
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f0),
                                (long)local_fc);
            local_168 = *pvVar7;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),
                                (long)local_fc);
            local_170 = *pvVar7;
            for (local_174 = local_11c; local_174 < local_120; local_174 = local_174 + 1) {
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_98,(long)local_174);
              local_180 = *pvVar7;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)local_174)
              ;
              local_184 = *pvVar6;
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),
                                  (long)local_184);
              local_190 = *pvVar7;
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),
                                  (long)local_184);
              local_198 = *pvVar7;
              local_1a0 = -1e+200;
              local_1a8 = 1e+200;
              if (local_180 <= 0.0) {
                if (((-local_f0 < local_168) && (local_100 < 2)) &&
                   ((local_100 == 0 || (local_190 < -local_f0)))) {
                  local_1a8 = (double)(1 - local_100) * local_190 +
                              (local_168 - local_110) / local_180 + local_150;
                }
                if (((local_170 < local_f0) && (local_104 < 2)) &&
                   ((local_104 == 0 || (local_f0 < local_198)))) {
                  local_1a0 = ((double)(1 - local_104) * local_198 +
                              (local_170 - local_118) / local_180) - local_148;
                }
              }
              else {
                if (((-local_f0 < local_168) && (local_100 < 2)) &&
                   ((local_100 == 0 || (local_f0 < local_198)))) {
                  local_1a0 = ((double)(1 - local_100) * local_198 +
                              (local_168 - local_110) / local_180) - local_150;
                }
                if (((local_170 < local_f0) && (local_104 < 2)) &&
                   ((local_104 == 0 || (local_190 < -local_f0)))) {
                  local_1a8 = (double)(1 - local_104) * local_190 +
                              (local_170 - local_118) / local_180 + local_148;
                }
              }
              if ((local_1a8 < local_198 - 1e-12) && (local_1a8 < local_f0)) {
                pdVar8 = std::max<double>(&local_1a8,&local_190);
                dVar1 = *pdVar8;
                pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),
                                    (long)local_184);
                *pvVar7 = dVar1;
                local_f8 = local_f8 + 1;
              }
              if ((local_190 + 1e-12 < local_1a0) && (-local_f0 < local_1a0)) {
                pdVar8 = std::min<double>(&local_1a0,&local_198);
                dVar1 = *pdVar8;
                pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),
                                    (long)local_184);
                *pvVar7 = dVar1;
                local_f8 = local_f8 + 1;
              }
            }
          }
        }
      }
    } while ((local_f8 != 0) && (local_f4 = local_f4 + 1, local_f4 < 0xb));
    local_1b0 = 0.001;
    for (local_1b4 = 0; local_1b4 < *(int *)(in_RDI + 0x60c); local_1b4 = local_1b4 + 1) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_e8,(long)local_1b4);
      dVar1 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_d0,(long)local_1b4);
      if (*pvVar7 + local_1b0 < dVar1) {
        local_1c0 = local_1b0 * 100.0;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),
                            (long)local_1b4);
        dVar1 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),
                            (long)local_1b4);
        if (local_1b0 + 1e-08 <= dVar1 - *pvVar7) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),
                              (long)local_1b4);
          vVar11 = *pvVar7;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_e8,(long)local_1b4);
          if (vVar11 < *pvVar7) {
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),
                                (long)local_1b4);
            local_1d8 = *pvVar7 + local_1c0;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_e8,(long)local_1b4);
            pdVar8 = std::min<double>(&local_1d8,pvVar7);
            in_stack_fffffffffffffd10 = (allocator_type *)*pdVar8;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),
                                (long)local_1b4);
            *pvVar7 = (value_type)in_stack_fffffffffffffd10;
          }
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),
                              (long)local_1b4);
          vVar11 = *pvVar7;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_d0,(long)local_1b4);
          if (*pvVar7 <= vVar11 && vVar11 != *pvVar7) {
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),
                                (long)local_1b4);
            local_1e0 = *pvVar7 - local_1c0;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_d0,(long)local_1b4);
            pdVar8 = std::min<double>(&local_1e0,pvVar7);
            dVar1 = *pdVar8;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),
                                (long)local_1b4);
            *pvVar7 = dVar1;
          }
        }
        else {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_d0,(long)local_1b4);
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),
                              (long)local_1b4);
          local_1c8 = *pvVar9 - local_1c0;
          pdVar8 = std::max<double>(pvVar7,&local_1c8);
          dVar1 = *pdVar8;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),
                              (long)local_1b4);
          *pvVar7 = dVar1;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_e8,(long)local_1b4);
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),
                              (long)local_1b4);
          local_1d0 = *pvVar9 + local_1c0;
          pdVar8 = std::min<double>(pvVar7,&local_1d0);
          dVar1 = *pdVar8;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),
                              (long)local_1b4);
          *pvVar7 = dVar1;
        }
      }
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd10);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd10);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd10);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd10);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd10);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd10);
  }
  return;
}

Assistant:

void HModel::setup_tightenBound() {
    if (intOption[INTOPT_TIGHT_FLAG] == 0)
        return;

    // Make a AR copy
    vector<int> iwork(numRow, 0);
    vector<int> ARstart(numRow + 1, 0);
    int AcountX = Aindex.size();
    vector<int> ARindex(AcountX);
    vector<double> ARvalue(AcountX);
    for (int k = 0; k < AcountX; k++)
        iwork[Aindex[k]]++;
    for (int i = 1; i <= numRow; i++)
        ARstart[i] = ARstart[i - 1] + iwork[i - 1];
    for (int i = 0; i < numRow; i++)
        iwork[i] = ARstart[i];
    for (int iCol = 0; iCol < numCol; iCol++) {
        for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
            int iRow = Aindex[k];
            int iPut = iwork[iRow]++;
            ARindex[iPut] = iCol;
            ARvalue[iPut] = Avalue[k];
        }
    }

    // Save column bounds
    vector<double> colLower0 = colLower;
    vector<double> colUpper0 = colUpper;

    double big_B = 1e10;
    int iPass = 0;
    for (;;) {
        int numberChanged = 0;
        for (int iRow = 0; iRow < numRow; iRow++) {
            // SKIP free rows
            if (rowLower[iRow] < -big_B && rowUpper[iRow] > big_B)
                continue;

            // possible row
            int ninfU = 0;
            int ninfL = 0;
            double xmaxU = 0.0;
            double xminL = 0.0;
            int myStart = ARstart[iRow];
            int myEnd = ARstart[iRow + 1];
            // Compute possible lower and upper ranges

            for (int k = myStart; k < myEnd; ++k) {
                int iCol = ARindex[k];
                double value = ARvalue[k];
                double upper = value > 0 ? colUpper[iCol] : -colLower[iCol];
                double lower = value > 0 ? colLower[iCol] : -colUpper[iCol];
                value = fabs(value);
                if (upper < big_B)
                    xmaxU += upper * value;
                else
                    ++ninfU;
                if (lower > -big_B)
                    xminL += lower * value;
                else
                    ++ninfL;
            }

            // Build in a margin of error
            xmaxU += 1.0e-8 * fabs(xmaxU);
            xminL -= 1.0e-8 * fabs(xminL);

            double xminLmargin =
                    (fabs(xminL) > 1.0e8) ? 1e-12 * fabs(xminL) : 0;
            double xmaxUmargin =
                    (fabs(xmaxU) > 1.0e8) ? 1e-12 * fabs(xmaxU) : 0;

            // Skip redundant row : also need to consider U < L  case
            double comp_U = xmaxU + ninfU * 1.0e31;
            double comp_L = xminL - ninfL * 1.0e31;
            if (comp_U <= rowUpper[iRow] + 1e-7
                    && comp_L >= rowLower[iRow] - 1e-7)
                continue;

            double row_L = rowLower[iRow];
            double row_U = rowUpper[iRow];

            // Now see if we can tighten column bounds
            for (int k = myStart; k < myEnd; ++k) {
                double value = ARvalue[k];
                int iCol = ARindex[k];
                double col_L = colLower[iCol];
                double col_U = colUpper[iCol];
                double new_L = -HSOL_CONST_INF;
                double new_U = +HSOL_CONST_INF;

                if (value > 0.0) {
                    if (row_L > -big_B && ninfU <= 1
                            && (ninfU == 0 || col_U > +big_B))
                        new_L = (row_L - xmaxU) / value + (1 - ninfU) * col_U
                                - xmaxUmargin;
                    if (row_U < +big_B && ninfL <= 1
                            && (ninfL == 0 || col_L < -big_B))
                        new_U = (row_U - xminL) / value + (1 - ninfL) * col_L
                                + xminLmargin;
                } else {
                    if (row_L > -big_B && ninfU <= 1
                            && (ninfU == 0 || col_L < -big_B))
                        new_U = (row_L - xmaxU) / value + (1 - ninfU) * col_L
                                + xmaxUmargin;
                    if (row_U < +big_B && ninfL <= 1
                            && (ninfL == 0 || col_U > +big_B))
                        new_L = (row_U - xminL) / value + (1 - ninfL) * col_U
                                - xminLmargin;
                }

                if (new_U < col_U - 1.0e-12 && new_U < big_B) {
                    colUpper[iCol] = max(new_U, col_L);
                    numberChanged++;
                }
                if (new_L > col_L + 1.0e-12 && new_L > -big_B) {
                    colLower[iCol] = min(new_L, col_U);
                    numberChanged++;
                }
            }
        }

        if (numberChanged == 0)
            break;
        iPass++;
        if (iPass > 10)
            break;

    }

    double useTolerance = 1.0e-3;
    for (int iCol = 0; iCol < numCol; iCol++) {
        if (colUpper0[iCol] > colLower0[iCol] + useTolerance) {
            const double relax = 100.0 * useTolerance;
            if (colUpper[iCol] - colLower[iCol] < useTolerance + 1.0e-8) {
                colLower[iCol] = max(colLower0[iCol], colLower[iCol] - relax);
                colUpper[iCol] = min(colUpper0[iCol], colUpper[iCol] + relax);
            } else {
                if (colUpper[iCol] < colUpper0[iCol]) {
                    colUpper[iCol] = min(colUpper[iCol] + relax,
                            colUpper0[iCol]);
                }
                if (colLower[iCol] > colLower0[iCol]) {
                    colLower[iCol] = min(colLower[iCol] - relax,
                            colLower0[iCol]);
                }
            }
        }
    }
}